

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

String * __thiscall
Jinx::Impl::Parser::CheckLibraryName_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pbVar1;
  bool bVar2;
  Symbol *pSVar3;
  pointer __rhs;
  String tokenName;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar3 = (this->m_currentSymbol)._M_current;
  if (pSVar3->type != NameValue) {
    bVar2 = IsKeyword(pSVar3->type);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    pSVar3 = (this->m_currentSymbol)._M_current;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (&local_40,&pSVar3->text);
  bVar2 = std::operator==(&local_40,
                          &((this->m_library).
                            super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->m_name);
  if (bVar2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
              (__return_storage_ptr__,
               &((this->m_library).
                 super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_name
              );
  }
  else {
    pbVar1 = (this->m_importList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__rhs = (this->m_importList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
      bVar2 = std::operator==(&local_40,__rhs);
      if (bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (__return_storage_ptr__,__rhs);
        break;
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::CheckLibraryName() const
	{
		String libraryName;
		if (m_currentSymbol->type == SymbolType::NameValue || IsKeyword(m_currentSymbol->type))
		{
			auto tokenName = m_currentSymbol->text;
			if (tokenName == m_library->GetName())
			{
				libraryName = m_library->GetName();
			}
			else
			{
				for (auto & importName : m_importList)
				{
					if (tokenName == importName)
					{
						libraryName = importName;
						break;
					}
				}
			}
		}
		return libraryName;
	}